

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjFileParser.cpp
# Opt level: O0

size_t __thiscall Assimp::ObjFileParser::getNumComponentsInDataDefinition(ObjFileParser *this)

{
  bool bVar1;
  bool bVar2;
  bool local_23;
  bool isNum;
  reference pcStack_20;
  bool end_of_definition;
  char *tmp;
  size_t numComponents;
  ObjFileParser *this_local;
  
  tmp = (char *)0x0;
  numComponents = (size_t)this;
  pcStack_20 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
               operator[](&this->m_DataIt,0);
  bVar1 = false;
  while( true ) {
    if (bVar1) {
      return (size_t)tmp;
    }
    bVar2 = isDataDefinitionEnd(pcStack_20);
    if (bVar2) {
      pcStack_20 = pcStack_20 + 2;
    }
    else {
      bVar2 = IsLineEnd<char>(*pcStack_20);
      if (bVar2) {
        bVar1 = true;
      }
    }
    bVar2 = SkipSpaces<char>(&stack0xffffffffffffffe0);
    if (!bVar2) break;
    bVar2 = IsNumeric<char>(*pcStack_20);
    local_23 = true;
    if (!bVar2) {
      local_23 = isNanOrInf(pcStack_20);
    }
    SkipToken(&stack0xffffffffffffffe0);
    if (local_23 != false) {
      tmp = tmp + 1;
    }
    bVar2 = SkipSpaces<char>(&stack0xffffffffffffffe0);
    if (!bVar2) {
      return (size_t)tmp;
    }
  }
  return (size_t)tmp;
}

Assistant:

size_t ObjFileParser::getNumComponentsInDataDefinition() {
    size_t numComponents( 0 );
    const char* tmp( &m_DataIt[0] );
    bool end_of_definition = false;
    while ( !end_of_definition ) {
        if ( isDataDefinitionEnd( tmp ) ) {
            tmp += 2;
        } else if ( IsLineEnd( *tmp ) ) {
            end_of_definition = true;
        }
        if ( !SkipSpaces( &tmp ) ) {
            break;
        }
        const bool isNum( IsNumeric( *tmp ) || isNanOrInf(tmp));
        SkipToken( tmp );
        if ( isNum ) {
            ++numComponents;
        }
        if ( !SkipSpaces( &tmp ) ) {
            break;
        }
    }
    return numComponents;
}